

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall QFileDialogPrivate::goToDirectory(QFileDialogPrivate *this,QString *path)

{
  QWidget *this_00;
  QAbstractProxyModel *pQVar1;
  QFileSystemModel *pQVar2;
  Data *pDVar3;
  qsizetype qVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  QAbstractItemModel *pQVar10;
  QFileDialogPrivate *this_01;
  long in_FS_OFFSET;
  QStringView QVar11;
  QAnyStringView QVar12;
  QStringView QVar13;
  QDir dir;
  undefined1 *local_d8;
  QString local_d0;
  QString local_b8;
  undefined1 local_98 [16];
  QAbstractItemModel *pQStack_88;
  undefined8 local_78;
  char16_t *pcStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_70 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar10 = QComboBox::model(&((this->qFileDialogUi).d)->lookInCombo->super_QComboBox);
  iVar8 = QComboBox::currentIndex(&((this->qFileDialogUi).d)->lookInCombo->super_QComboBox);
  iVar9 = QComboBox::modelColumn(&((this->qFileDialogUi).d)->lookInCombo->super_QComboBox);
  QComboBox::rootModelIndex
            ((QModelIndex *)&local_58,&((this->qFileDialogUi).d)->lookInCombo->super_QComboBox);
  (**(code **)(*(long *)pQVar10 + 0x60))(&local_78,pQVar10,iVar8,iVar9,&local_58);
  local_98._0_8_ = (path->d).d;
  local_98._8_8_ = (path->d).ptr;
  pQStack_88 = (QAbstractItemModel *)(path->d).size;
  if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((QArrayData *)local_98._0_8_)->ref_)->ref_)._q_value.super___atomic_base<int>.
    _M_i = (((QArrayData *)&((QArrayData *)local_98._0_8_)->ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((int)(local_78._4_4_ | (uint)local_78) < 0 ||
      (QFileDialogPrivate *)local_68.ptr == (QFileDialogPrivate *)0x0) {
    pQVar2 = this->model;
    getEnvironmentVariable(&local_d0,(QFileDialogPrivate *)local_68.ptr,path);
    QFileSystemModel::index((QString *)&local_b8,(int)pQVar2);
    pQVar1 = this->proxyModel;
    if (pQVar1 == (QAbstractProxyModel *)0x0) {
      local_58._16_8_ = local_b8.d.size;
      local_58.shared = (PrivateShared *)local_b8.d.d;
      local_58._8_8_ = local_b8.d.ptr;
    }
    else {
      (**(code **)(*(long *)pQVar1 + 0x198))(&local_58,pQVar1,&local_b8);
    }
    local_68.ptr = (QAbstractItemModel *)local_58._16_8_;
    local_78 = (QArrayData *)local_58.shared;
    pcStack_70 = (char16_t *)local_58._8_8_;
    if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    (**(code **)(*(long *)local_68.ptr + 0x90))(&local_58,local_68.ptr,&local_78,0x101);
    ::QVariant::toUrl();
    QUrl::toLocalFile();
    uVar6 = local_98._8_8_;
    uVar5 = local_98._0_8_;
    qVar4 = local_b8.d.size;
    pDVar3 = local_b8.d.d;
    local_b8.d.d = (Data *)local_98._0_8_;
    local_98._0_8_ = pDVar3;
    local_98._8_8_ = local_b8.d.ptr;
    local_b8.d.ptr = (char16_t *)uVar6;
    local_b8.d.size = (qsizetype)pQStack_88;
    pQStack_88 = (QAbstractItemModel *)qVar4;
    if ((QArrayData *)uVar5 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar5)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar5)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar5)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
      }
    }
    QUrl::~QUrl((QUrl *)&local_d0);
    ::QVariant::~QVariant((QVariant *)&local_58);
    QFileSystemModel::index((QString *)&local_b8,(int)this->model);
    pQVar1 = this->proxyModel;
    if (pQVar1 == (QAbstractProxyModel *)0x0) {
      local_58._16_8_ = local_b8.d.size;
      local_58.shared = (PrivateShared *)local_b8.d.d;
      local_58._8_8_ = local_b8.d.ptr;
    }
    else {
      (**(code **)(*(long *)pQVar1 + 0x198))(&local_58,pQVar1,&local_b8);
    }
    local_68.ptr = (QAbstractItemModel *)local_58._16_8_;
    local_78 = (QArrayData *)local_58.shared;
    pcStack_70 = (char16_t *)local_58._8_8_;
  }
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = (QFileDialogPrivate *)local_98;
  QDir::QDir((QDir *)&local_d8,(QString *)this_01);
  cVar7 = QDir::exists();
  if (cVar7 == '\0') {
    getEnvironmentVariable((QString *)&local_58,this_01,(QString *)local_98);
    QDir::setPath((QString *)&local_d8);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
  }
  cVar7 = QDir::exists();
  if ((cVar7 == '\0') && (pQStack_88 != (QAbstractItemModel *)0x0)) {
    cVar7 = '\0';
    QFileSystemModel::myComputer((int)&local_58);
    ::QVariant::toString();
    if (pQStack_88 == (QAbstractItemModel *)local_b8.d.size) {
      QVar11.m_data = (storage_type_conflict *)local_98._8_8_;
      QVar11.m_size = (qsizetype)pQStack_88;
      QVar13.m_data = local_b8.d.ptr;
      QVar13.m_size = (qsizetype)pQStack_88;
      cVar7 = QtPrivate::equalStrings(QVar11,QVar13);
    }
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    ::QVariant::~QVariant((QVariant *)&local_58);
    if (cVar7 == '\0') {
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QMetaObject::tr((char *)local_58.data,(char *)&QFileDialog::staticMetaObject,0x6e5a81);
      QWidget::windowTitle(&local_b8,this_00);
      QVar12.m_size = (size_t)&local_58;
      QVar12.field_0.m_data = &local_d0;
      QString::arg_impl(QVar12,(int)local_98._8_8_,(QChar)(char16_t)pQStack_88);
      QMessageBox::warning(this_00,&local_b8,&local_d0,(StandardButtons)0x400,NoButton);
      if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_58.shared = *(int *)local_58.shared + -1;
        UNLOCK();
        if (*(int *)local_58.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
        }
      }
      goto LAB_004e9053;
    }
  }
  enterDirectory(this,(QModelIndex *)&local_78);
LAB_004e9053:
  QDir::~QDir((QDir *)&local_d8);
  if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::goToDirectory(const QString &path)
{
    enum { UrlRole = Qt::UserRole + 1 };

 #if QT_CONFIG(messagebox)
    Q_Q(QFileDialog);
#endif
    QModelIndex index = qFileDialogUi->lookInCombo->model()->index(qFileDialogUi->lookInCombo->currentIndex(),
                                                    qFileDialogUi->lookInCombo->modelColumn(),
                                                    qFileDialogUi->lookInCombo->rootModelIndex());
    QString path2 = path;
    if (!index.isValid())
        index = mapFromSource(model->index(getEnvironmentVariable(path)));
    else {
        path2 = index.data(UrlRole).toUrl().toLocalFile();
        index = mapFromSource(model->index(path2));
    }
    QDir dir(path2);
    if (!dir.exists())
        dir.setPath(getEnvironmentVariable(path2));

    if (dir.exists() || path2.isEmpty() || path2 == model->myComputer().toString()) {
        enterDirectory(index);
#if QT_CONFIG(messagebox)
    } else {
        QString message = QFileDialog::tr("%1\nDirectory not found.\nPlease verify the "
                                          "correct directory name was given.");
        QMessageBox::warning(q, q->windowTitle(), message.arg(path2));
#endif // QT_CONFIG(messagebox)
    }
}